

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

void boost::detail::function::
     void_function_obj_invoker0<boost::_bi::bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>,_void>
     ::invoke(function_buffer *function_obj_ptr)

{
  ulong *puVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  puVar1 = *(ulong **)function_obj_ptr;
  UNRECOVERED_JUMPTABLE = (code *)*puVar1;
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE =
         *(code **)(UNRECOVERED_JUMPTABLE + *(long *)(puVar1[2] + puVar1[1]) + -1);
  }
  (*UNRECOVERED_JUMPTABLE)();
  return;
}

Assistant:

static BOOST_FUNCTION_VOID_RETURN_TYPE
        invoke(function_buffer& function_obj_ptr BOOST_FUNCTION_COMMA
               BOOST_FUNCTION_PARMS)

        {
          FunctionObj* f;
          if (function_allows_small_object_optimization<FunctionObj>::value)
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.data);
          else
            f = reinterpret_cast<FunctionObj*>(function_obj_ptr.members.obj_ptr);
          BOOST_FUNCTION_RETURN((*f)(BOOST_FUNCTION_ARGS));
        }